

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

int ShowDemoWindowWidgets::Funcs::MyResizeCallback(ImGuiInputTextCallbackData *data)

{
  char *pcVar1;
  int *in_RDI;
  ImVector<char> *my_str;
  int in_stack_ffffffffffffffec;
  ImVector<char> *this;
  
  if (*in_RDI == 0x40000) {
    this = *(ImVector<char> **)(in_RDI + 2);
    ImVector<char>::resize(this,in_stack_ffffffffffffffec);
    pcVar1 = ImVector<char>::begin(this);
    *(char **)(in_RDI + 6) = pcVar1;
  }
  return 0;
}

Assistant:

static int MyResizeCallback(ImGuiInputTextCallbackData* data)
                {
                    if (data->EventFlag == ImGuiInputTextFlags_CallbackResize)
                    {
                        ImVector<char>* my_str = (ImVector<char>*)data->UserData;
                        IM_ASSERT(my_str->begin() == data->Buf);
                        my_str->resize(data->BufSize); // NB: On resizing calls, generally data->BufSize == data->BufTextLen + 1
                        data->Buf = my_str->begin();
                    }
                    return 0;
                }